

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Load_Glyph(FT_Face face,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Int FVar1;
  FT_GlyphSlot slot_00;
  FT_Driver pFVar2;
  FT_Module pFVar3;
  FT_Size pFVar4;
  FT_Face_Internal pFVar5;
  bool bVar6;
  FT_Error FVar7;
  char *pcVar8;
  FT_Long FVar9;
  FT_Renderer_conflict pFVar10;
  bool bVar11;
  FT_Render_Mode local_94;
  FT_Render_Mode mode_1;
  FT_Renderer_conflict renderer;
  FT_Face_Internal internal_1;
  FT_Size_Metrics *metrics;
  FT_Int transform_flags;
  FT_Face_Internal internal;
  FT_AutoHinter_Interface hinting;
  FT_Bool is_light_type1;
  FT_Render_Mode mode;
  TT_Face_conflict ttface;
  FT_Module hinter;
  FT_Bool autohint;
  FT_Library library;
  FT_GlyphSlot slot;
  FT_Driver driver;
  uint local_20;
  FT_Error error;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  FT_Face face_local;
  
  bVar6 = false;
  if (((face != (FT_Face)0x0) && (face->size != (FT_Size)0x0)) &&
     (face->glyph != (FT_GlyphSlot_conflict)0x0)) {
    slot_00 = face->glyph;
    ft_glyphslot_clear(slot_00);
    pFVar2 = face->driver;
    pFVar3 = ((pFVar2->root).library)->auto_hinter;
    local_20 = load_flags;
    if ((load_flags & 0x400U) != 0) {
      local_20 = load_flags | 0x801;
    }
    if ((local_20 & 1) != 0) {
      local_20 = local_20 & 0xfffffffb | 10;
    }
    if ((local_20 & 0x400000) != 0) {
      local_20 = local_20 & 0xfffffffb;
    }
    if (((((pFVar3 != (FT_Module)0x0) && ((local_20 & 2) == 0)) &&
         (((local_20 & 0x8000) == 0 &&
          (((((pFVar2->root).clazz)->module_flags & 0x100) != 0 &&
           ((((pFVar2->root).clazz)->module_flags & 0x200) == 0)))))) &&
        ((face->face_flags & 0x2000U) == 0)) &&
       ((((local_20 & 0x800) != 0 ||
         (((face->internal->transform_matrix).yx == 0 &&
          ((face->internal->transform_matrix).xx != 0)))) ||
        (((face->internal->transform_matrix).xx == 0 && ((face->internal->transform_matrix).yx != 0)
         ))))) {
      if (((local_20 & 0x20) == 0) && ((((pFVar2->root).clazz)->module_flags & 0x400) != 0)) {
        pcVar8 = FT_Get_Font_Format(face);
        pcVar8 = strstr(pcVar8,"Type 1");
        bVar11 = false;
        if (pcVar8 != (char *)0x0) {
          bVar11 = *(int *)&pFVar2[1].root.clazz == 1;
        }
        if ((((((int)local_20 >> 0x10 & 0xf) == FT_RENDER_MODE_LIGHT) &&
             ((((pFVar2->root).clazz)->module_flags & 0x800) == 0)) && (!bVar11)) ||
           ((((face->face_flags & 8U) != 0 && (face[4].sizes_list.tail != (FT_ListNode)0x0)) &&
            ((*(short *)((long)&face[1].extensions + 6) == 0 &&
             ((*(long *)&face[4].num_fixed_sizes == 0 && (*(long *)&face[4].num_charmaps == 0)))))))
           ) {
          bVar6 = true;
        }
      }
      else {
        bVar6 = true;
      }
    }
    if (bVar6) {
      if (((((face->face_flags & 2U) == 0) || ((local_20 & 8) != 0)) ||
          (FVar7 = (*pFVar2->clazz->load_glyph)(slot_00,face->size,glyph_index,local_20 | 0x4000),
          FVar7 != 0)) || (slot_00->format != FT_GLYPH_FORMAT_BITMAP)) {
        pFVar5 = face->internal;
        FVar1 = pFVar5->transform_flags;
        pFVar5->transform_flags = 0;
        driver._4_4_ = (**(code **)((long)pFVar3->clazz->module_interface + 0x18))
                                 (pFVar3,slot_00,face->size,glyph_index,local_20);
        pFVar5->transform_flags = FVar1;
      }
      else {
        driver._4_4_ = 0;
      }
    }
    else {
      FVar7 = (*pFVar2->clazz->load_glyph)(slot_00,face->size,glyph_index,local_20);
      if (FVar7 != 0) {
        return FVar7;
      }
      driver._4_4_ = 0;
      if (slot_00->format == FT_GLYPH_FORMAT_OUTLINE) {
        FVar7 = FT_Outline_Check(&slot_00->outline);
        if (FVar7 != 0) {
          return FVar7;
        }
        driver._4_4_ = 0;
        if ((local_20 & 2) == 0) {
          ft_glyphslot_grid_fit_metrics(slot_00,(byte)local_20 & 0x10);
        }
      }
    }
    if ((local_20 & 0x10) == 0) {
      (slot_00->advance).x = (slot_00->metrics).horiAdvance;
      (slot_00->advance).y = 0;
    }
    else {
      (slot_00->advance).x = 0;
      (slot_00->advance).y = (slot_00->metrics).vertAdvance;
    }
    if (((local_20 & 0x2000) == 0) && ((face->face_flags & 1U) != 0)) {
      pFVar4 = face->size;
      FVar9 = FT_MulDiv(slot_00->linearHoriAdvance,(pFVar4->metrics).x_scale,0x40);
      slot_00->linearHoriAdvance = FVar9;
      FVar9 = FT_MulDiv(slot_00->linearVertAdvance,(pFVar4->metrics).y_scale,0x40);
      slot_00->linearVertAdvance = FVar9;
    }
    if (((local_20 & 0x800) == 0) && (pFVar5 = face->internal, pFVar5->transform_flags != 0)) {
      pFVar10 = ft_lookup_glyph_renderer(slot_00);
      if (pFVar10 == (FT_Renderer_conflict)0x0) {
        if (slot_00->format == FT_GLYPH_FORMAT_OUTLINE) {
          if ((pFVar5->transform_flags & 1U) != 0) {
            FT_Outline_Transform(&slot_00->outline,&pFVar5->transform_matrix);
          }
          if ((pFVar5->transform_flags & 2U) != 0) {
            FT_Outline_Translate
                      (&slot_00->outline,(pFVar5->transform_delta).x,(pFVar5->transform_delta).y);
          }
        }
      }
      else {
        driver._4_4_ = (*pFVar10->clazz->transform_glyph)
                                 (pFVar10,slot_00,&pFVar5->transform_matrix,&pFVar5->transform_delta
                                 );
      }
      FT_Vector_Transform(&slot_00->advance,&pFVar5->transform_matrix);
    }
    if ((((driver._4_4_ == 0) && ((local_20 & 1) == 0)) &&
        (slot_00->format != FT_GLYPH_FORMAT_BITMAP)) &&
       (slot_00->format != FT_GLYPH_FORMAT_COMPOSITE)) {
      local_94 = (int)local_20 >> 0x10 & 0xf;
      if ((local_94 == FT_RENDER_MODE_NORMAL) && ((local_20 & 0x1000) != 0)) {
        local_94 = FT_RENDER_MODE_MONO;
      }
      if ((local_20 & 4) == 0) {
        ft_glyphslot_preset_bitmap(slot_00,local_94,(FT_Vector *)0x0);
      }
      else {
        driver._4_4_ = FT_Render_Glyph(slot_00,local_94);
      }
    }
    return driver._4_4_;
  }
  return 0x23;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Load_Glyph( FT_Face   face,
                 FT_UInt   glyph_index,
                 FT_Int32  load_flags )
  {
    FT_Error      error;
    FT_Driver     driver;
    FT_GlyphSlot  slot;
    FT_Library    library;
    FT_Bool       autohint = FALSE;
    FT_Module     hinter;
    TT_Face       ttface = (TT_Face)face;


    if ( !face || !face->size || !face->glyph )
      return FT_THROW( Invalid_Face_Handle );

    /* The validity test for `glyph_index' is performed by the */
    /* font drivers.                                           */

    slot = face->glyph;
    ft_glyphslot_clear( slot );

    driver  = face->driver;
    library = driver->root.library;
    hinter  = library->auto_hinter;

    /* resolve load flags dependencies */

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE         |
                    FT_LOAD_IGNORE_TRANSFORM;

    if ( load_flags & FT_LOAD_NO_SCALE )
    {
      load_flags |= FT_LOAD_NO_HINTING |
                    FT_LOAD_NO_BITMAP;

      load_flags &= ~FT_LOAD_RENDER;
    }

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      load_flags &= ~FT_LOAD_RENDER;

    /*
     * Determine whether we need to auto-hint or not.
     * The general rules are:
     *
     * - Do only auto-hinting if we have
     *
     *   - a hinter module,
     *   - a scalable font format dealing with outlines,
     *   - not a tricky font, and
     *   - no transforms except simple slants and/or rotations by
     *     integer multiples of 90 degrees.
     *
     * - Then, auto-hint if FT_LOAD_FORCE_AUTOHINT is set or if we don't
     *   have a native font hinter.
     *
     * - Otherwise, auto-hint for LIGHT hinting mode or if there isn't
     *   any hinting bytecode in the TrueType/OpenType font.
     *
     * - Exception: The font is `tricky' and requires the native hinter to
     *   load properly.
     */

    if ( hinter                                           &&
         !( load_flags & FT_LOAD_NO_HINTING )             &&
         !( load_flags & FT_LOAD_NO_AUTOHINT )            &&
         FT_DRIVER_IS_SCALABLE( driver )                  &&
         FT_DRIVER_USES_OUTLINES( driver )                &&
         !FT_IS_TRICKY( face )                            &&
         ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM )    ||
           ( face->internal->transform_matrix.yx == 0 &&
             face->internal->transform_matrix.xx != 0 ) ||
           ( face->internal->transform_matrix.xx == 0 &&
             face->internal->transform_matrix.yx != 0 ) ) )
    {
      if ( ( load_flags & FT_LOAD_FORCE_AUTOHINT ) ||
           !FT_DRIVER_HAS_HINTER( driver )         )
        autohint = TRUE;
      else
      {
        FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );
        FT_Bool         is_light_type1;


        /* only the new Adobe engine (for both CFF and Type 1) is `light'; */
        /* we use `strstr' to catch both `Type 1' and `CID Type 1'         */
        is_light_type1 =
          ft_strstr( FT_Get_Font_Format( face ), "Type 1" ) != NULL   &&
          ((PS_Driver)driver)->hinting_engine == FT_HINTING_ADOBE;

        /* the check for `num_locations' assures that we actually    */
        /* test for instructions in a TTF and not in a CFF-based OTF */
        /*                                                           */
        /* since `maxSizeOfInstructions' might be unreliable, we     */
        /* check the size of the `fpgm' and `prep' tables, too --    */
        /* the assumption is that there don't exist real TTFs where  */
        /* both `fpgm' and `prep' tables are missing                 */
        if ( ( mode == FT_RENDER_MODE_LIGHT           &&
               ( !FT_DRIVER_HINTS_LIGHTLY( driver ) &&
                 !is_light_type1                    ) )         ||
             ( FT_IS_SFNT( face )                             &&
               ttface->num_locations                          &&
               ttface->max_profile.maxSizeOfInstructions == 0 &&
               ttface->font_program_size == 0                 &&
               ttface->cvt_program_size == 0                  ) )
          autohint = TRUE;
      }
    }

    if ( autohint )
    {
      FT_AutoHinter_Interface  hinting;


      /* try to load embedded bitmaps first if available            */
      /*                                                            */
      /* XXX: This is really a temporary hack that should disappear */
      /*      promptly with FreeType 2.1!                           */
      /*                                                            */
      if ( FT_HAS_FIXED_SIZES( face )              &&
           ( load_flags & FT_LOAD_NO_BITMAP ) == 0 )
      {
        error = driver->clazz->load_glyph( slot, face->size,
                                           glyph_index,
                                           load_flags | FT_LOAD_SBITS_ONLY );

        if ( !error && slot->format == FT_GLYPH_FORMAT_BITMAP )
          goto Load_Ok;
      }

      {
        FT_Face_Internal  internal        = face->internal;
        FT_Int            transform_flags = internal->transform_flags;


        /* since the auto-hinter calls FT_Load_Glyph by itself, */
        /* make sure that glyphs aren't transformed             */
        internal->transform_flags = 0;

        /* load auto-hinted outline */
        hinting = (FT_AutoHinter_Interface)hinter->clazz->module_interface;

        error   = hinting->load_glyph( (FT_AutoHinter)hinter,
                                       slot, face->size,
                                       glyph_index, load_flags );

        internal->transform_flags = transform_flags;
      }
    }
    else
    {
      error = driver->clazz->load_glyph( slot,
                                         face->size,
                                         glyph_index,
                                         load_flags );
      if ( error )
        goto Exit;

      if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
      {
        /* check that the loaded outline is correct */
        error = FT_Outline_Check( &slot->outline );
        if ( error )
          goto Exit;

#ifdef GRID_FIT_METRICS
        if ( !( load_flags & FT_LOAD_NO_HINTING ) )
          ft_glyphslot_grid_fit_metrics( slot,
              FT_BOOL( load_flags & FT_LOAD_VERTICAL_LAYOUT ) );
#endif
      }
    }

  Load_Ok:
    /* compute the advance */
    if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
    {
      slot->advance.x = 0;
      slot->advance.y = slot->metrics.vertAdvance;
    }
    else
    {
      slot->advance.x = slot->metrics.horiAdvance;
      slot->advance.y = 0;
    }

    /* compute the linear advance in 16.16 pixels */
    if ( ( load_flags & FT_LOAD_LINEAR_DESIGN ) == 0 &&
         FT_IS_SCALABLE( face )                      )
    {
      FT_Size_Metrics*  metrics = &face->size->metrics;


      /* it's tricky! */
      slot->linearHoriAdvance = FT_MulDiv( slot->linearHoriAdvance,
                                           metrics->x_scale, 64 );

      slot->linearVertAdvance = FT_MulDiv( slot->linearVertAdvance,
                                           metrics->y_scale, 64 );
    }

    if ( ( load_flags & FT_LOAD_IGNORE_TRANSFORM ) == 0 )
    {
      FT_Face_Internal  internal = face->internal;


      /* now, transform the glyph image if needed */
      if ( internal->transform_flags )
      {
        /* get renderer */
        FT_Renderer  renderer = ft_lookup_glyph_renderer( slot );


        if ( renderer )
          error = renderer->clazz->transform_glyph(
                                     renderer, slot,
                                     &internal->transform_matrix,
                                     &internal->transform_delta );
        else if ( slot->format == FT_GLYPH_FORMAT_OUTLINE )
        {
          /* apply `standard' transformation if no renderer is available */
          if ( internal->transform_flags & 1 )
            FT_Outline_Transform( &slot->outline,
                                  &internal->transform_matrix );

          if ( internal->transform_flags & 2 )
            FT_Outline_Translate( &slot->outline,
                                  internal->transform_delta.x,
                                  internal->transform_delta.y );
        }

        /* transform advance */
        FT_Vector_Transform( &slot->advance, &internal->transform_matrix );
      }
    }

    /* do we need to render the image or preset the bitmap now? */
    if ( !error                                    &&
         ( load_flags & FT_LOAD_NO_SCALE ) == 0    &&
         slot->format != FT_GLYPH_FORMAT_BITMAP    &&
         slot->format != FT_GLYPH_FORMAT_COMPOSITE )
    {
      FT_Render_Mode  mode = FT_LOAD_TARGET_MODE( load_flags );


      if ( mode == FT_RENDER_MODE_NORMAL   &&
           load_flags & FT_LOAD_MONOCHROME )
        mode = FT_RENDER_MODE_MONO;

      if ( load_flags & FT_LOAD_RENDER )
        error = FT_Render_Glyph( slot, mode );
      else
        ft_glyphslot_preset_bitmap( slot, mode, NULL );
    }

    FT_TRACE5(( "FT_Load_Glyph: index %d, flags %x\n",
                glyph_index, load_flags               ));
    FT_TRACE5(( "  x advance: %f\n", slot->advance.x / 64.0 ));
    FT_TRACE5(( "  y advance: %f\n", slot->advance.y / 64.0 ));
    FT_TRACE5(( "  linear x advance: %f\n",
                slot->linearHoriAdvance / 65536.0 ));
    FT_TRACE5(( "  linear y advance: %f\n",
                slot->linearVertAdvance / 65536.0 ));
    FT_TRACE5(( "  bitmap %dx%d, mode %d\n",
                slot->bitmap.width, slot->bitmap.rows,
                slot->bitmap.pixel_mode               ));

  Exit:
    return error;
  }